

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_index_info *
allocateIndexInfo(WhereInfo *pWInfo,WhereClause *pWC,Bitmask mUnusable,SrcItem *pSrc,u16 *pmNoOmit)

{
  WhereInfo *pParse_00;
  ExprList *pEVar1;
  Table *pTVar2;
  Expr *pEVar3;
  Expr *pEVar4;
  int iVar5;
  int iVar6;
  SrcList *pSVar7;
  ExprList *pEVar8;
  uint local_dc;
  Expr *pExpr_1;
  char *pcStack_c8;
  u16 op;
  char *zColl;
  Expr *pE2;
  Expr *pExpr;
  int n;
  ExprList *pOrderBy;
  int eDistinct;
  Table *pTab;
  u16 mNoOmit;
  sqlite3_index_info *pIdxInfo;
  WhereTerm *pWStack_78;
  int nOrderBy;
  WhereTerm *pTerm;
  HiddenIndexInfo *pHidden;
  sqlite3_index_constraint_usage *pUsage;
  sqlite3_index_orderby *pIdxOrderBy;
  sqlite3_index_constraint *pIdxCons;
  Parse *pParse;
  int local_40;
  int nTerm;
  int j;
  int i;
  u16 *pmNoOmit_local;
  SrcItem *pSrc_local;
  Bitmask mUnusable_local;
  WhereClause *pWC_local;
  WhereInfo *pWInfo_local;
  
  pParse_00 = (WhereInfo *)pWInfo->pParse;
  pTab._6_2_ = 0;
  pOrderBy._4_4_ = 0;
  pEVar1 = pWInfo->pOrderBy;
  pTVar2 = pSrc->pTab;
  pParse._4_4_ = 0;
  nTerm = 0;
  pWStack_78 = pWC->a;
  for (; nTerm < pWC->nTerm; nTerm = nTerm + 1) {
    pWStack_78->wtFlags = pWStack_78->wtFlags & 0xffbf;
    if (((((pWStack_78->leftCursor == pSrc->iCursor) && ((pWStack_78->prereqRight & mUnusable) == 0)
          ) && ((pWStack_78->eOperator & 0xf7ff) != 0)) && ((pWStack_78->wtFlags & 0x80) == 0)) &&
       ((((pSrc->fg).jointype & 0x58) == 0 ||
        (iVar5 = constraintCompatibleWithOuterJoin(pWStack_78,pSrc), iVar5 != 0)))) {
      pParse._4_4_ = pParse._4_4_ + 1;
      pWStack_78->wtFlags = pWStack_78->wtFlags | 0x40;
    }
    pWStack_78 = pWStack_78 + 1;
  }
  pIdxInfo._4_4_ = 0;
  if (pEVar1 != (ExprList *)0x0) {
    iVar5 = pEVar1->nExpr;
    for (nTerm = 0; nTerm < iVar5; nTerm = nTerm + 1) {
      pEVar3 = pEVar1->a[nTerm].pExpr;
      iVar6 = sqlite3ExprIsConstant(pEVar3);
      if (iVar6 == 0) {
        if ((pEVar1->a[nTerm].fg.sortFlags & 2) != 0) break;
        if ((pEVar3->op != 0xa7) || (pEVar3->iTable != pSrc->iCursor)) {
          if ((pEVar3->op != 'q') ||
             ((pEVar4 = pEVar3->pLeft, pEVar4->op != 0xa7 || (pEVar4->iTable != pSrc->iCursor))))
          break;
          pEVar3->iColumn = pEVar4->iColumn;
          if (-1 < pEVar4->iColumn) {
            pcStack_c8 = sqlite3ColumnColl(pTVar2->aCol + pEVar4->iColumn);
            if (pcStack_c8 == (char *)0x0) {
              pcStack_c8 = "BINARY";
            }
            iVar6 = sqlite3_stricmp((pEVar3->u).zToken,pcStack_c8);
            if (iVar6 != 0) break;
          }
        }
      }
    }
    if (nTerm == iVar5) {
      pIdxInfo._4_4_ = iVar5;
      if ((pWInfo->wctrlFlags & 0x80) == 0) {
        pOrderBy._4_4_ = (uint)((pWInfo->wctrlFlags & 0x40) != 0);
      }
      else {
        pOrderBy._4_4_ = ((pWInfo->wctrlFlags & 0x200) != 0) + 2;
      }
    }
  }
  pWInfo_local = (WhereInfo *)
                 sqlite3DbMallocZero((sqlite3 *)pParse_00->pParse,
                                     (long)pParse._4_4_ * 0x14 + (long)pIdxInfo._4_4_ * 8 + 0x88 +
                                     (long)pParse._4_4_ * 8);
  if (pWInfo_local == (WhereInfo *)0x0) {
    sqlite3ErrorMsg((Parse *)pParse_00,"out of memory");
    pWInfo_local = (WhereInfo *)0x0;
  }
  else {
    pSVar7 = (SrcList *)((long)(pWInfo_local->sWC).aStatic + (long)pParse._4_4_ * 8 + -0x10);
    pEVar8 = (ExprList *)((long)pSVar7->a + (long)pParse._4_4_ * 0xc + -8);
    pWInfo_local->pTabList = pSVar7;
    pWInfo_local->pResultSet = pEVar8;
    pWInfo_local->pSelect = (Select *)((long)pEVar8->a + (long)pIdxInfo._4_4_ * 8 + -8);
    pWInfo_local->revMask = (Bitmask)pWC;
    (pWInfo_local->sWC).pWInfo = pParse_00;
    *(uint *)&(pWInfo_local->sWC).pOuter = pOrderBy._4_4_;
    *(undefined4 *)((long)&(pWInfo_local->sWC).pOuter + 4) = 0;
    local_40 = 0;
    nTerm = 0;
    pWStack_78 = pWC->a;
    for (; nTerm < pWC->nTerm; nTerm = nTerm + 1) {
      if ((pWStack_78->wtFlags & 0x40) != 0) {
        *(int *)((long)pSVar7->a + (long)local_40 * 0xc + -8) = (pWStack_78->u).x.leftColumn;
        *(int *)((long)&pSVar7->a[0].pSchema + (long)local_40 * 0xc) = nTerm;
        pExpr_1._6_2_ = pWStack_78->eOperator & 0x3fff;
        if (pExpr_1._6_2_ == 1) {
          if ((pWStack_78->wtFlags & 0x8000) == 0) {
            if (local_40 < 0x20) {
              local_dc = 1 << ((byte)local_40 & 0x1f);
            }
            else {
              local_dc = 0;
            }
            *(uint *)((long)&(pWInfo_local->sWC).pOuter + 4) =
                 local_dc | *(uint *)((long)&(pWInfo_local->sWC).pOuter + 4);
          }
          pExpr_1._6_2_ = 2;
        }
        if (pExpr_1._6_2_ == 0x40) {
          *(u8 *)((long)pSVar7->a + (long)local_40 * 0xc + -4) = pWStack_78->eMatchOp;
        }
        else if ((pExpr_1._6_2_ & 0x180) == 0) {
          *(char *)((long)pSVar7->a + (long)local_40 * 0xc + -4) = (char)pExpr_1._6_2_;
          if (((pExpr_1._6_2_ & 0x3c) != 0) &&
             (iVar5 = sqlite3ExprIsVector(pWStack_78->pExpr->pRight), iVar5 != 0)) {
            if (local_40 < 0x10) {
              pTab._6_2_ = pTab._6_2_ | (ushort)(1 << ((byte)local_40 & 0x1f));
            }
            if (pExpr_1._6_2_ == 0x10) {
              *(undefined1 *)((long)pSVar7->a + (long)local_40 * 0xc + -4) = 8;
            }
            if (pExpr_1._6_2_ == 4) {
              *(undefined1 *)((long)pSVar7->a + (long)local_40 * 0xc + -4) = 0x20;
            }
          }
        }
        else if (pExpr_1._6_2_ == 0x100) {
          *(undefined1 *)((long)pSVar7->a + (long)local_40 * 0xc + -4) = 0x47;
        }
        else {
          *(undefined1 *)((long)pSVar7->a + (long)local_40 * 0xc + -4) = 0x48;
        }
        local_40 = local_40 + 1;
      }
      pWStack_78 = pWStack_78 + 1;
    }
    *(int *)&pWInfo_local->pParse = local_40;
    local_40 = 0;
    for (nTerm = 0; nTerm < pIdxInfo._4_4_; nTerm = nTerm + 1) {
      pEVar3 = pEVar1->a[nTerm].pExpr;
      iVar5 = sqlite3ExprIsConstant(pEVar3);
      if (iVar5 == 0) {
        *(int *)((long)pEVar8->a + (long)local_40 * 8 + -8) = (int)pEVar3->iColumn;
        *(byte *)((long)pEVar8->a + (long)local_40 * 8 + -4) = pEVar1->a[nTerm].fg.sortFlags & 1;
        local_40 = local_40 + 1;
      }
    }
    *(int *)&pWInfo_local->pOrderBy = local_40;
    *pmNoOmit = pTab._6_2_;
  }
  return (sqlite3_index_info *)pWInfo_local;
}

Assistant:

static sqlite3_index_info *allocateIndexInfo(
  WhereInfo *pWInfo,              /* The WHERE clause */
  WhereClause *pWC,               /* The WHERE clause being analyzed */
  Bitmask mUnusable,              /* Ignore terms with these prereqs */
  SrcItem *pSrc,                  /* The FROM clause term that is the vtab */
  u16 *pmNoOmit                   /* Mask of terms not to omit */
){
  int i, j;
  int nTerm;
  Parse *pParse = pWInfo->pParse;
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_orderby *pIdxOrderBy;
  struct sqlite3_index_constraint_usage *pUsage;
  struct HiddenIndexInfo *pHidden;
  WhereTerm *pTerm;
  int nOrderBy;
  sqlite3_index_info *pIdxInfo;
  u16 mNoOmit = 0;
  const Table *pTab;
  int eDistinct = 0;
  ExprList *pOrderBy = pWInfo->pOrderBy;

  assert( pSrc!=0 );
  pTab = pSrc->pTab;
  assert( pTab!=0 );
  assert( IsVirtual(pTab) );

  /* Find all WHERE clause constraints referring to this virtual table.
  ** Mark each term with the TERM_OK flag.  Set nTerm to the number of
  ** terms found.
  */
  for(i=nTerm=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    pTerm->wtFlags &= ~TERM_OK;
    if( pTerm->leftCursor != pSrc->iCursor ) continue;
    if( pTerm->prereqRight & mUnusable ) continue;
    assert( IsPowerOfTwo(pTerm->eOperator & ~WO_EQUIV) );
    testcase( pTerm->eOperator & WO_IN );
    testcase( pTerm->eOperator & WO_ISNULL );
    testcase( pTerm->eOperator & WO_IS );
    testcase( pTerm->eOperator & WO_ALL );
    if( (pTerm->eOperator & ~(WO_EQUIV))==0 ) continue;
    if( pTerm->wtFlags & TERM_VNULL ) continue;

    assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
    assert( pTerm->u.x.leftColumn>=XN_ROWID );
    assert( pTerm->u.x.leftColumn<pTab->nCol );
    if( (pSrc->fg.jointype & (JT_LEFT|JT_LTORJ|JT_RIGHT))!=0
     && !constraintCompatibleWithOuterJoin(pTerm,pSrc)
    ){
      continue;
    }
    nTerm++;
    pTerm->wtFlags |= TERM_OK;
  }

  /* If the ORDER BY clause contains only columns in the current
  ** virtual table then allocate space for the aOrderBy part of
  ** the sqlite3_index_info structure.
  */
  nOrderBy = 0;
  if( pOrderBy ){
    int n = pOrderBy->nExpr;
    for(i=0; i<n; i++){
      Expr *pExpr = pOrderBy->a[i].pExpr;
      Expr *pE2;

      /* Skip over constant terms in the ORDER BY clause */
      if( sqlite3ExprIsConstant(pExpr) ){
        continue;
      }

      /* Virtual tables are unable to deal with NULLS FIRST */
      if( pOrderBy->a[i].fg.sortFlags & KEYINFO_ORDER_BIGNULL ) break;

      /* First case - a direct column references without a COLLATE operator */
      if( pExpr->op==TK_COLUMN && pExpr->iTable==pSrc->iCursor ){
        assert( pExpr->iColumn>=XN_ROWID && pExpr->iColumn<pTab->nCol );
        continue;
      }

      /* 2nd case - a column reference with a COLLATE operator.  Only match
      ** of the COLLATE operator matches the collation of the column. */
      if( pExpr->op==TK_COLLATE
       && (pE2 = pExpr->pLeft)->op==TK_COLUMN
       && pE2->iTable==pSrc->iCursor
      ){
        const char *zColl;  /* The collating sequence name */
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        assert( pExpr->u.zToken!=0 );
        assert( pE2->iColumn>=XN_ROWID && pE2->iColumn<pTab->nCol );
        pExpr->iColumn = pE2->iColumn;
        if( pE2->iColumn<0 ) continue;  /* Collseq does not matter for rowid */
        zColl = sqlite3ColumnColl(&pTab->aCol[pE2->iColumn]);
        if( zColl==0 ) zColl = sqlite3StrBINARY;
        if( sqlite3_stricmp(pExpr->u.zToken, zColl)==0 ) continue;
      }

      /* No matches cause a break out of the loop */
      break;
    }
    if( i==n ){
      nOrderBy = n;
      if( (pWInfo->wctrlFlags & WHERE_DISTINCTBY) ){
        eDistinct = 2 + ((pWInfo->wctrlFlags & WHERE_SORTBYGROUP)!=0);
      }else if( pWInfo->wctrlFlags & WHERE_GROUPBY ){
        eDistinct = 1;
      }
    }
  }

  /* Allocate the sqlite3_index_info structure
  */
  pIdxInfo = sqlite3DbMallocZero(pParse->db, sizeof(*pIdxInfo)
                           + (sizeof(*pIdxCons) + sizeof(*pUsage))*nTerm
                           + sizeof(*pIdxOrderBy)*nOrderBy + sizeof(*pHidden)
                           + sizeof(sqlite3_value*)*nTerm );
  if( pIdxInfo==0 ){
    sqlite3ErrorMsg(pParse, "out of memory");
    return 0;
  }
  pHidden = (struct HiddenIndexInfo*)&pIdxInfo[1];
  pIdxCons = (struct sqlite3_index_constraint*)&pHidden->aRhs[nTerm];
  pIdxOrderBy = (struct sqlite3_index_orderby*)&pIdxCons[nTerm];
  pUsage = (struct sqlite3_index_constraint_usage*)&pIdxOrderBy[nOrderBy];
  pIdxInfo->aConstraint = pIdxCons;
  pIdxInfo->aOrderBy = pIdxOrderBy;
  pIdxInfo->aConstraintUsage = pUsage;
  pHidden->pWC = pWC;
  pHidden->pParse = pParse;
  pHidden->eDistinct = eDistinct;
  pHidden->mIn = 0;
  for(i=j=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    u16 op;
    if( (pTerm->wtFlags & TERM_OK)==0 ) continue;
    pIdxCons[j].iColumn = pTerm->u.x.leftColumn;
    pIdxCons[j].iTermOffset = i;
    op = pTerm->eOperator & WO_ALL;
    if( op==WO_IN ){
      if( (pTerm->wtFlags & TERM_SLICE)==0 ){
        pHidden->mIn |= SMASKBIT32(j);
      }
      op = WO_EQ;
    }
    if( op==WO_AUX ){
      pIdxCons[j].op = pTerm->eMatchOp;
    }else if( op & (WO_ISNULL|WO_IS) ){
      if( op==WO_ISNULL ){
        pIdxCons[j].op = SQLITE_INDEX_CONSTRAINT_ISNULL;
      }else{
        pIdxCons[j].op = SQLITE_INDEX_CONSTRAINT_IS;
      }
    }else{
      pIdxCons[j].op = (u8)op;
      /* The direct assignment in the previous line is possible only because
      ** the WO_ and SQLITE_INDEX_CONSTRAINT_ codes are identical.  The
      ** following asserts verify this fact. */
      assert( WO_EQ==SQLITE_INDEX_CONSTRAINT_EQ );
      assert( WO_LT==SQLITE_INDEX_CONSTRAINT_LT );
      assert( WO_LE==SQLITE_INDEX_CONSTRAINT_LE );
      assert( WO_GT==SQLITE_INDEX_CONSTRAINT_GT );
      assert( WO_GE==SQLITE_INDEX_CONSTRAINT_GE );
      assert( pTerm->eOperator&(WO_IN|WO_EQ|WO_LT|WO_LE|WO_GT|WO_GE|WO_AUX) );

      if( op & (WO_LT|WO_LE|WO_GT|WO_GE)
       && sqlite3ExprIsVector(pTerm->pExpr->pRight)
      ){
        testcase( j!=i );
        if( j<16 ) mNoOmit |= (1 << j);
        if( op==WO_LT ) pIdxCons[j].op = WO_LE;
        if( op==WO_GT ) pIdxCons[j].op = WO_GE;
      }
    }

    j++;
  }
  assert( j==nTerm );
  pIdxInfo->nConstraint = j;
  for(i=j=0; i<nOrderBy; i++){
    Expr *pExpr = pOrderBy->a[i].pExpr;
    if( sqlite3ExprIsConstant(pExpr) ) continue;
    assert( pExpr->op==TK_COLUMN
         || (pExpr->op==TK_COLLATE && pExpr->pLeft->op==TK_COLUMN
              && pExpr->iColumn==pExpr->pLeft->iColumn) );
    pIdxOrderBy[j].iColumn = pExpr->iColumn;
    pIdxOrderBy[j].desc = pOrderBy->a[i].fg.sortFlags & KEYINFO_ORDER_DESC;
    j++;
  }
  pIdxInfo->nOrderBy = j;

  *pmNoOmit = mNoOmit;
  return pIdxInfo;
}